

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall
cashew::JSPrinter::printChild(JSPrinter *this,Ref child,Ref parent,int childPosition)

{
  bool bVar1;
  
  bVar1 = needParens(this,parent,child,childPosition);
  if (bVar1) {
    emit(this,'(');
    print(this,child);
    emit(this,')');
    return;
  }
  print(this,child);
  return;
}

Assistant:

void printChild(Ref child, Ref parent, int childPosition = 0) {
    bool parens = needParens(parent, child, childPosition);
    if (parens) {
      emit('(');
    }
    print(child);
    if (parens) {
      emit(')');
    }
  }